

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# initializer.cpp
# Opt level: O0

void Am_Initializer::Do_Initialize(void)

{
  bool bVar1;
  reference ppAVar2;
  _Self local_18;
  _Self local_10;
  iterator it;
  
  local_10._M_node =
       (_List_node_base *)
       std::__cxx11::list<Am_Initializer_*,_std::allocator<Am_Initializer_*>_>::begin
                 (am_initializer_list_abi_cxx11_);
  while( true ) {
    local_18._M_node =
         (_List_node_base *)
         std::__cxx11::list<Am_Initializer_*,_std::allocator<Am_Initializer_*>_>::end
                   (am_initializer_list_abi_cxx11_);
    bVar1 = std::operator!=(&local_10,&local_18);
    if (!bVar1) break;
    ppAVar2 = std::_List_iterator<Am_Initializer_*>::operator*(&local_10);
    if ((*ppAVar2)->init != (Am_Initializer_Procedure *)0x0) {
      ppAVar2 = std::_List_iterator<Am_Initializer_*>::operator*(&local_10);
      (*(*ppAVar2)->init)();
    }
    std::_List_iterator<Am_Initializer_*>::operator++(&local_10);
  }
  return;
}

Assistant:

void
Am_Initializer::Do_Initialize()
{
  for (INITIALIZERLIST::iterator it = am_initializer_list->begin();
       it != am_initializer_list->end(); ++it) {
    // check if we have a function to call
    if ((*it)->init != static_cast<Am_Initializer_Procedure *>(nullptr)) {
#ifdef LEAK_TRACE
      DERR("Initializing: " << (*it)->name << "\t\tPriority: "
                            << (*it)->priority << std::endl);
#endif
      // call the init() function stored in the Am_Initializer object
      (*it)->init();
    }
  }
}